

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::str_writer<wchar_t>>
          (basic_writer<fmt::v6::buffer_range<wchar_t>> *this,format_specs *specs,
          str_writer<wchar_t> *f)

{
  size_t sVar1;
  wchar_t wVar2;
  undefined8 *puVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  byte bVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  wchar_t __tmp;
  wchar_t *__src;
  size_t size;
  void *__dest;
  ulong uVar13;
  buffer<wchar_t> *c;
  ulong uVar14;
  int iVar20;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar27;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  uVar14 = (ulong)(uint)specs->width;
  uVar10 = f->size_;
  puVar3 = *(undefined8 **)this;
  lVar11 = puVar3[2];
  uVar12 = uVar14 - uVar10;
  if (uVar14 < uVar10 || uVar12 == 0) {
    uVar10 = uVar10 + lVar11;
    if ((ulong)puVar3[3] < uVar10) {
      (**(code **)*puVar3)(puVar3,uVar10);
    }
    puVar3[2] = uVar10;
    sVar4 = f->size_;
    if (sVar4 != 0) {
      __dest = (void *)(lVar11 * 4 + puVar3[1]);
      __src = f->s;
LAB_0019584d:
      memmove(__dest,__src,sVar4 << 2);
      return;
    }
  }
  else {
    uVar13 = lVar11 + uVar14;
    if ((ulong)puVar3[3] < uVar13) {
      (**(code **)*puVar3)(puVar3,uVar13);
    }
    puVar3[2] = uVar13;
    auVar7 = _DAT_0019d820;
    auVar6 = _DAT_0019ac20;
    auVar5 = _DAT_00198020;
    lVar9 = puVar3[1];
    __dest = (void *)(lVar9 + lVar11 * 4);
    wVar2 = (specs->fill).data_[0];
    bVar8 = specs->field_0x9 & 0xf;
    if (bVar8 == 3) {
      uVar13 = uVar12 >> 1;
      if (1 < uVar12) {
        __dest = (void *)((long)__dest + uVar13 * 4);
        uVar12 = uVar13 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar25._8_4_ = (int)uVar12;
        auVar25._0_8_ = uVar12;
        auVar25._12_4_ = (int)(uVar12 >> 0x20);
        lVar9 = lVar9 + lVar11 * 4;
        lVar11 = 0;
        auVar25 = auVar25 ^ _DAT_00198020;
        do {
          auVar22._8_4_ = (int)lVar11;
          auVar22._0_8_ = lVar11;
          auVar22._12_4_ = (int)((ulong)lVar11 >> 0x20);
          auVar26 = (auVar22 | auVar6) ^ auVar5;
          iVar20 = auVar25._4_4_;
          if ((bool)(~(auVar26._4_4_ == iVar20 && auVar25._0_4_ < auVar26._0_4_ ||
                      iVar20 < auVar26._4_4_) & 1)) {
            *(wchar_t *)(lVar9 + lVar11 * 4) = wVar2;
          }
          if ((auVar26._12_4_ != auVar25._12_4_ || auVar26._8_4_ <= auVar25._8_4_) &&
              auVar26._12_4_ <= auVar25._12_4_) {
            *(wchar_t *)(lVar9 + 4 + lVar11 * 4) = wVar2;
          }
          auVar22 = (auVar22 | auVar7) ^ auVar5;
          iVar27 = auVar22._4_4_;
          if (iVar27 <= iVar20 && (iVar27 != iVar20 || auVar22._0_4_ <= auVar25._0_4_)) {
            *(wchar_t *)(lVar9 + 8 + lVar11 * 4) = wVar2;
            *(wchar_t *)(lVar9 + 0xc + lVar11 * 4) = wVar2;
          }
          lVar11 = lVar11 + 4;
        } while ((uVar12 - ((uint)(uVar13 + 0x3fffffffffffffff) & 3)) + 4 != lVar11);
      }
      sVar1 = f->size_ * 4;
      if (f->size_ != 0) {
        memmove(__dest,f->s,sVar1);
      }
      auVar7 = _DAT_0019d820;
      auVar6 = _DAT_0019ac20;
      auVar5 = _DAT_00198020;
      if (uVar14 != uVar10) {
        uVar12 = (uVar14 * 4 + (uVar10 + uVar13) * -4) - 4;
        auVar26._8_4_ = (int)uVar12;
        auVar26._0_8_ = uVar12;
        auVar26._12_4_ = (int)(uVar12 >> 0x20);
        auVar17._0_8_ = uVar12 >> 2;
        auVar17._8_8_ = auVar26._8_8_ >> 2;
        uVar10 = 0;
        auVar17 = auVar17 ^ _DAT_00198020;
        do {
          auVar23._8_4_ = (int)uVar10;
          auVar23._0_8_ = uVar10;
          auVar23._12_4_ = (int)(uVar10 >> 0x20);
          auVar25 = (auVar23 | auVar6) ^ auVar5;
          iVar20 = auVar17._4_4_;
          if ((bool)(~(auVar25._4_4_ == iVar20 && auVar17._0_4_ < auVar25._0_4_ ||
                      iVar20 < auVar25._4_4_) & 1)) {
            *(wchar_t *)((long)__dest + uVar10 * 4 + sVar1) = wVar2;
          }
          if ((auVar25._12_4_ != auVar17._12_4_ || auVar25._8_4_ <= auVar17._8_4_) &&
              auVar25._12_4_ <= auVar17._12_4_) {
            *(wchar_t *)((long)__dest + uVar10 * 4 + sVar1 + 4) = wVar2;
          }
          auVar25 = (auVar23 | auVar7) ^ auVar5;
          iVar27 = auVar25._4_4_;
          if (iVar27 <= iVar20 && (iVar27 != iVar20 || auVar25._0_4_ <= auVar17._0_4_)) {
            *(wchar_t *)((long)__dest + uVar10 * 4 + sVar1 + 8) = wVar2;
            *(wchar_t *)((long)__dest + uVar10 * 4 + sVar1 + 0xc) = wVar2;
          }
          uVar10 = uVar10 + 4;
        } while (((uVar12 >> 2) + 4 & 0xfffffffffffffffc) != uVar10);
      }
    }
    else if (bVar8 == 2) {
      if (uVar14 != uVar10) {
        __dest = (void *)((long)__dest + uVar12 * 4);
        uVar12 = (uVar14 * 4 + uVar10 * -4) - 4;
        auVar15._8_4_ = (int)uVar12;
        auVar15._0_8_ = uVar12;
        auVar15._12_4_ = (int)(uVar12 >> 0x20);
        auVar16._0_8_ = uVar12 >> 2;
        auVar16._8_8_ = auVar15._8_8_ >> 2;
        lVar9 = lVar9 + lVar11 * 4;
        uVar10 = 0;
        auVar16 = auVar16 ^ _DAT_00198020;
        do {
          auVar21._8_4_ = (int)uVar10;
          auVar21._0_8_ = uVar10;
          auVar21._12_4_ = (int)(uVar10 >> 0x20);
          auVar25 = (auVar21 | auVar6) ^ auVar5;
          iVar20 = auVar16._4_4_;
          if ((bool)(~(auVar25._4_4_ == iVar20 && auVar16._0_4_ < auVar25._0_4_ ||
                      iVar20 < auVar25._4_4_) & 1)) {
            *(wchar_t *)(lVar9 + uVar10 * 4) = wVar2;
          }
          if ((auVar25._12_4_ != auVar16._12_4_ || auVar25._8_4_ <= auVar16._8_4_) &&
              auVar25._12_4_ <= auVar16._12_4_) {
            *(wchar_t *)(lVar9 + 4 + uVar10 * 4) = wVar2;
          }
          auVar25 = (auVar21 | auVar7) ^ auVar5;
          iVar27 = auVar25._4_4_;
          if (iVar27 <= iVar20 && (iVar27 != iVar20 || auVar25._0_4_ <= auVar16._0_4_)) {
            *(wchar_t *)(lVar9 + 8 + uVar10 * 4) = wVar2;
            *(wchar_t *)(lVar9 + 0xc + uVar10 * 4) = wVar2;
          }
          uVar10 = uVar10 + 4;
        } while (((uVar12 >> 2) + 4 & 0xfffffffffffffffc) != uVar10);
      }
      sVar4 = f->size_;
      if (sVar4 != 0) {
        __src = f->s;
        goto LAB_0019584d;
      }
    }
    else {
      sVar1 = f->size_ * 4;
      if (f->size_ != 0) {
        memmove(__dest,f->s,sVar1);
      }
      auVar7 = _DAT_0019d820;
      auVar6 = _DAT_0019ac20;
      auVar5 = _DAT_00198020;
      if (uVar14 != uVar10) {
        uVar12 = (uVar14 * 4 + uVar10 * -4) - 4;
        auVar18._8_4_ = (int)uVar12;
        auVar18._0_8_ = uVar12;
        auVar18._12_4_ = (int)(uVar12 >> 0x20);
        auVar19._0_8_ = uVar12 >> 2;
        auVar19._8_8_ = auVar18._8_8_ >> 2;
        lVar9 = lVar11 * 4 + sVar1 + lVar9;
        uVar10 = 0;
        auVar19 = auVar19 ^ _DAT_00198020;
        do {
          auVar24._8_4_ = (int)uVar10;
          auVar24._0_8_ = uVar10;
          auVar24._12_4_ = (int)(uVar10 >> 0x20);
          auVar25 = (auVar24 | auVar6) ^ auVar5;
          iVar20 = auVar19._4_4_;
          if ((bool)(~(auVar25._4_4_ == iVar20 && auVar19._0_4_ < auVar25._0_4_ ||
                      iVar20 < auVar25._4_4_) & 1)) {
            *(wchar_t *)(lVar9 + uVar10 * 4) = wVar2;
          }
          if ((auVar25._12_4_ != auVar19._12_4_ || auVar25._8_4_ <= auVar19._8_4_) &&
              auVar25._12_4_ <= auVar19._12_4_) {
            *(wchar_t *)(lVar9 + 4 + uVar10 * 4) = wVar2;
          }
          auVar25 = (auVar24 | auVar7) ^ auVar5;
          iVar27 = auVar25._4_4_;
          if (iVar27 <= iVar20 && (iVar27 != iVar20 || auVar25._0_4_ <= auVar19._0_4_)) {
            *(wchar_t *)(lVar9 + 8 + uVar10 * 4) = wVar2;
            *(wchar_t *)(lVar9 + 0xc + uVar10 * 4) = wVar2;
          }
          uVar10 = uVar10 + 4;
        } while (((uVar12 >> 2) + 4 & 0xfffffffffffffffc) != uVar10);
      }
    }
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }